

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_copy_bytes(CBS *cbs,uint8_t *out,size_t len)

{
  ulong uVar1;
  uint8_t *in_RAX;
  int iVar2;
  
  uVar1 = cbs->len;
  if (len <= uVar1) {
    in_RAX = cbs->data;
    cbs->data = in_RAX + len;
    cbs->len = uVar1 - len;
  }
  iVar2 = 0;
  if ((len <= uVar1) && (iVar2 = 1, len != 0)) {
    memcpy(out,in_RAX,len);
  }
  return iVar2;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}